

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O3

void pnga_step_bound_info
               (Integer g_xx,Integer g_vv,Integer g_xxll,Integer g_xxuu,void *boundmin,
               void *wolfemin,void *boundmax)

{
  long lVar1;
  long local_278;
  long local_270;
  long local_268;
  void *local_260;
  void *local_258;
  Integer local_250;
  Integer xxuutype;
  Integer xxlltype;
  Integer vvtype;
  Integer xxtype;
  Integer xxuulo [7];
  Integer xxllhi [7];
  Integer xxlllo [7];
  Integer vvhi [7];
  Integer vvlo [7];
  Integer xxhi [7];
  Integer xxlo [7];
  Integer xxuuhi [7];
  
  local_260 = wolfemin;
  local_258 = boundmin;
  pnga_inquire(g_xx,&xxtype,&local_250,xxhi);
  pnga_inquire(g_vv,&vvtype,&local_268,vvhi);
  pnga_inquire(g_xxll,&xxlltype,&local_270,xxllhi);
  pnga_inquire(g_xxuu,&xxuutype,&local_278,xxuuhi);
  if (local_250 != 0) {
    lVar1 = 0;
    do {
      xxlo[local_250 + lVar1 + -1] = 1;
      vvlo[local_268 + lVar1 + -1] = 1;
      xxlllo[local_270 + lVar1 + -1] = 1;
      xxuulo[local_278 + lVar1 + -1] = 1;
      lVar1 = lVar1 + -1;
    } while (-lVar1 != local_250);
    local_250 = 0;
    local_268 = local_268 + lVar1;
    local_270 = local_270 + lVar1;
    local_278 = local_278 + lVar1;
  }
  pnga_step_bound_info_patch
            (g_xx,xxlo,xxhi,g_vv,vvlo,vvhi,g_xxll,xxlllo,xxllhi,g_xxuu,xxuulo,xxuuhi,local_258,
             local_260,boundmax);
  return;
}

Assistant:

void pnga_step_bound_info(Integer g_xx, Integer g_vv, Integer g_xxll,
                          Integer g_xxuu,  void *boundmin, void *wolfemin,
                          void *boundmax)
{
  Integer xxtype, xxndim;
  Integer vvtype, vvndim;
  Integer xxlltype, xxllndim;
  Integer xxuutype, xxuundim;
  Integer xxlo[MAXDIM],xxhi[MAXDIM];
  Integer vvlo[MAXDIM],vvhi[MAXDIM];
  Integer xxlllo[MAXDIM],xxllhi[MAXDIM];
  Integer xxuulo[MAXDIM],xxuuhi[MAXDIM];

  pnga_inquire(g_xx,  &xxtype, &xxndim, xxhi);
  pnga_inquire(g_vv,  &vvtype, &vvndim, vvhi);
  pnga_inquire(g_xxll,  &xxlltype, &xxllndim, xxllhi);
  pnga_inquire(g_xxuu,  &xxuutype, &xxuundim, xxuuhi);
  while(xxndim){
    xxlo[xxndim-1]=1;
    xxndim--;
    vvlo[vvndim-1]=1;
    vvndim--;
    xxlllo[xxllndim-1]=1;
    xxllndim--;
    xxuulo[xxuundim-1]=1;
    xxuundim--;
  }

  pnga_step_bound_info_patch(g_xx,xxlo,xxhi, g_vv,vvlo,vvhi, g_xxll,xxlllo,xxllhi, g_xxuu,xxuulo,xxuuhi, boundmin, wolfemin, boundmax);
}